

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtils.cpp
# Opt level: O2

void ApprovalTests::FileUtils::ensureFileExists(string *fullFilePath)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  bVar1 = fileExists(fullFilePath);
  if (!bVar1) {
    ::std::__cxx11::string::string((string *)&local_30,(string *)fullFilePath);
    ::std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::operator()((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  *)EmptyFileCreatorFactory::currentCreator_abi_cxx11_,&local_30);
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void FileUtils::ensureFileExists(const std::string& fullFilePath)
    {
        if (!fileExists(fullFilePath))
        {
            EmptyFileCreatorFactory::currentCreator(fullFilePath);
        }
    }